

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource.cc
# Opt level: O1

size_t __thiscall
InputSource::read_line(InputSource *this,string *str,size_t count,qpdf_offset_t at)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  
  if (-1 < at) {
    (*this->_vptr_InputSource[5])(this,at,0);
  }
  std::__cxx11::string::resize((ulong)str,(char)count);
  iVar1 = (*this->_vptr_InputSource[7])(this,(str->_M_dataplus)._M_p,count);
  std::__cxx11::string::resize((ulong)str,(char)iVar1);
  uVar2 = std::__cxx11::string::find_first_of((char *)str,0x2607e9,0);
  if (uVar2 == 0xffffffffffffffff) {
    (*this->_vptr_InputSource[5])(this,this->last_offset,0);
    (*this->_vptr_InputSource[2])(this);
  }
  else {
    lVar3 = std::__cxx11::string::find_first_not_of((char *)str,0x2607e9,uVar2);
    std::__cxx11::string::resize((ulong)str,(char)uVar2);
    (*this->_vptr_InputSource[5])(this,lVar3 + this->last_offset,0);
  }
  return uVar2;
}

Assistant:

size_t
InputSource::read_line(std::string& str, size_t count, qpdf_offset_t at)
{
    // Return at most max_line_length characters from the next line. Lines are terminated by one or
    // more \r or \n characters. Consume the trailing newline characters but don't return them.
    // After this is called, the file will be positioned after a line terminator or at the end of
    // the file, and last_offset will point to position the file had when this method was called.

    read(str, count, at);
    auto eol = str.find_first_of("\n\r"sv);
    if (eol != std::string::npos) {
        auto next_line = str.find_first_not_of("\n\r"sv, eol);
        str.resize(eol);
        if (eol != std::string::npos) {
            seek(last_offset + static_cast<qpdf_offset_t>(next_line), SEEK_SET);
            return eol;
        }
    }
    // We did not necessarily find the end of the trailing newline sequence.
    seek(last_offset, SEEK_SET);
    findAndSkipNextEOL();
    return eol;
}